

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

Array<const_unsigned_int> * __thiscall
kj::heapArray<unsigned_int_const,unsigned_int_const*>
          (Array<const_unsigned_int> *__return_storage_ptr__,kj *this,uint *begin,uint *end)

{
  uint *__dest;
  Array<const_unsigned_int> *result;
  ulong __n;
  uint *puVar1;
  
  __dest = (uint *)_::HeapArrayDisposer::allocateImpl
                             (4,0,(long)begin - (long)this >> 2,(_func_void_void_ptr *)0x0,
                              (_func_void_void_ptr *)0x0);
  puVar1 = __dest;
  if ((long)begin - (long)this != 0) {
    __n = (long)begin - (long)this & 0xfffffffffffffffc;
    memcpy(__dest,this,__n);
    puVar1 = (uint *)(__n + (long)__dest);
  }
  __return_storage_ptr__->ptr = __dest;
  __return_storage_ptr__->size_ = (long)puVar1 - (long)__dest >> 2;
  __return_storage_ptr__->disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  return __return_storage_ptr__;
}

Assistant:

Array<T>
heapArray(Iterator begin, Iterator end) {
  ArrayBuilder<T> builder = heapArrayBuilder<T>(end - begin);
  builder.addAll(begin, end);
  return builder.finish();
}